

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::getdashorder(Forth *this)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  
  requireDStackAvailable
            (this,((long)(this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) + 1,"GET-ORDER");
  puVar2 = (uint *)(this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  puVar1 = (uint *)(this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  puVar3 = puVar2;
  if (puVar2 != puVar1) {
    do {
      ForthStack<unsigned_int>::push(&this->dStack,*puVar2);
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
    puVar2 = (uint *)(this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    puVar3 = (uint *)(this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  ForthStack<unsigned_int>::push(&this->dStack,(uint)((ulong)((long)puVar2 - (long)puVar3) >> 2));
  return;
}

Assistant:

void getdashorder(){
			REQUIRE_DSTACK_AVAILABLE(searchOrder.size()+1, "GET-ORDER");
			for(auto i : searchOrder ){
				dStack.push(i); 
			}
			dStack.push(CELL(searchOrder.size())); 
		}